

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker
          (ZEbasic_leakChecker *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>_>
  *this_00;
  pointer pbVar1;
  long lVar2;
  long lVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  ctorsAndDtors *s;
  pointer pcVar8;
  size_t i;
  ulong uVar9;
  value_type name;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> set;
  key_type local_68;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> local_48
  ;
  
  (this->super_ZEValidationEntryPoints)._vptr_ZEValidationEntryPoints =
       (_func_int **)&PTR_zeInitPrologue_001d4188;
  std::operator<<((ostream *)&std::cerr,"Check balance of create/destroy calls\n");
  std::operator<<((ostream *)&std::cerr,
                  "----------------------------------------------------------\n");
  createDestroySet();
  this_00 = &this->counts;
  for (pcVar8 = local_48.
                super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar8 != local_48.
                super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
                ._M_impl.super__Vector_impl_data._M_finish; pcVar8 = pcVar8 + 1) {
    lVar6 = 0;
    lVar7 = 0;
    for (uVar9 = 0;
        pbVar1 = (pcVar8->ctors).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pcVar8->ctors).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar9 = uVar9 + 1) {
      std::__cxx11::string::string
                ((string *)&local_68,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_68);
      lVar2 = (pmVar4->super___atomic_base<long>)._M_i;
      if (uVar9 != 0) {
        std::operator<<((ostream *)&std::cerr," |\n");
      }
      lVar3 = std::cerr;
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0x1e;
      *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80;
      std::operator<<((ostream *)&std::cerr,(string *)&local_68);
      std::operator<<((ostream *)&std::cerr," = ");
      lVar3 = std::cerr;
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 5;
      *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x20;
      std::ostream::_M_insert<long>((long)&std::cerr);
      lVar7 = lVar7 + lVar2;
      std::__cxx11::string::~string((string *)&local_68);
      lVar6 = lVar6 + 0x20;
    }
    std::operator<<((ostream *)&std::cerr," \\--->");
    lVar6 = 0;
    for (uVar9 = 0;
        pbVar1 = (pcVar8->dtors).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pcVar8->dtors).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar9 = uVar9 + 1) {
      std::__cxx11::string::string
                ((string *)&local_68,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_68);
      lVar2 = (pmVar4->super___atomic_base<long>)._M_i;
      if (uVar9 != 0) {
        std::operator<<((ostream *)&std::cerr,"\n");
        lVar3 = std::cerr;
        *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0x2c;
        *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80
        ;
        std::operator<<((ostream *)&std::cerr,"\\--->");
      }
      lVar3 = std::cerr;
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 0x1e;
      *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80;
      std::operator<<((ostream *)&std::cerr,(string *)&local_68);
      std::operator<<((ostream *)&std::cerr," = ");
      lVar3 = std::cerr;
      *(undefined8 *)(std::__cxx11::string::append + *(long *)(std::cerr + -0x18)) = 5;
      *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) =
           *(uint *)(&std::runtime_error::typeinfo + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x20;
      std::ostream::_M_insert<long>((long)&std::cerr);
      lVar7 = lVar7 - lVar2;
      std::__cxx11::string::~string((string *)&local_68);
      lVar6 = lVar6 + 0x20;
    }
    if (lVar7 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr," ---> LEAK = ");
      std::ostream::_M_insert<long>((long)poVar5);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  ~vector(&local_48);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  return;
}

Assistant:

basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker() {
        std::cerr << "Check balance of create/destroy calls\n";
        std::cerr << "----------------------------------------------------------\n";
        auto set = createDestroySet();
        for (const auto &s : set) {
            auto &ctors = s.ctors;
            auto &dtors = s.dtors;
            int64_t diff = 0;
            for (size_t i = 0; i < ctors.size(); i++) {
                auto name = ctors[i];
                auto zeCount = counts[name].load();
                diff += zeCount;

                if (i > 0) {
                    std::cerr << " |\n";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            std::cerr << " \\--->";

            for (size_t i = 0; i < dtors.size(); i++) {
                auto name = dtors[i];
                auto zeCount = counts[name].load();
                diff -= zeCount;

                if (i > 0) {
                    std::cerr << "\n";
                    std::cerr << std::setw(44) << std::right << "\\--->";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            if (diff) {
                std::cerr << " ---> LEAK = " << diff;
            }

            std::cerr << std::endl;
        }
    }